

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemViewPrivate::addEditor
          (QAbstractItemViewPrivate *this,QModelIndex *index,QWidget *editor,bool isStatic)

{
  QModelIndex *in_RSI;
  QEditorInfo *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *in_stack_ffffffffffffff58;
  bool *this_00;
  QWidget *e;
  QPersistentModelIndex local_38;
  QWidget local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &in_RDI[0x22].isStatic;
  e = &local_30;
  QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)e,in_RSI);
  QHash<QWidget_*,_QPersistentModelIndex>::insert
            ((QHash<QWidget_*,_QPersistentModelIndex> *)this_00,
             (QWidget **)in_stack_ffffffffffffff58,(QPersistentModelIndex *)0x80d2b6);
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)e);
  QPersistentModelIndex::QPersistentModelIndex(&local_38,in_RSI);
  QEditorInfo::QEditorInfo(in_RDI,e,SUB81((ulong)this_00 >> 0x38,0));
  QHash<QPersistentModelIndex,_QEditorInfo>::insert
            ((QHash<QPersistentModelIndex,_QEditorInfo> *)this_00,in_stack_ffffffffffffff58,
             (QEditorInfo *)0x80d324);
  QEditorInfo::~QEditorInfo((QEditorInfo *)0x80d338);
  QPersistentModelIndex::~QPersistentModelIndex(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::addEditor(const QModelIndex &index, QWidget *editor, bool isStatic)
{
    editorIndexHash.insert(editor, index);
    indexEditorHash.insert(index, QEditorInfo(editor, isStatic));
}